

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O3

mstate init_user_mstate(char *tbase,size_t tsize)

{
  char *pcVar1;
  uint uVar2;
  char *pcVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  
  uVar6 = (ulong)(-(int)tbase - 0x10U & 0xf);
  pcVar1 = tbase + uVar6;
  memset((mstate)(tbase + uVar6 + 0x10),0,0x3b0);
  pcVar3 = tbase + uVar6 + 8;
  pcVar3[0] = -0x4d;
  pcVar3[1] = '\x03';
  pcVar3[2] = '\0';
  pcVar3[3] = '\0';
  pcVar3[4] = '\0';
  pcVar3[5] = '\0';
  pcVar3[6] = '\0';
  pcVar3[7] = '\0';
  *(char **)(tbase + uVar6 + 0x28) = tbase;
  *(char **)(tbase + uVar6 + 0x388) = tbase;
  *(size_t *)(tbase + uVar6 + 0x370) = tsize;
  *(size_t *)(tbase + uVar6 + 0x368) = tsize;
  *(size_t *)(tbase + uVar6 + 0x390) = tsize;
  *(size_t *)(tbase + uVar6 + 0x50) = mparams.magic;
  pcVar3 = tbase + uVar6 + 0x48;
  pcVar3[0] = -1;
  pcVar3[1] = '\x0f';
  pcVar3[2] = '\0';
  pcVar3[3] = '\0';
  pcVar3[4] = '\0';
  pcVar3[5] = '\0';
  pcVar3[6] = '\0';
  pcVar3[7] = '\0';
  uVar2 = mparams.default_mflags | 4;
  pcVar3 = tbase + uVar6 + 0x3a8;
  pcVar3[0] = '\0';
  pcVar3[1] = '\0';
  pcVar3[2] = '\0';
  pcVar3[3] = '\0';
  pcVar3[4] = '\0';
  pcVar3[5] = '\0';
  pcVar3[6] = '\0';
  pcVar3[7] = '\0';
  pcVar3 = tbase + uVar6 + 0x3b0;
  pcVar3[0] = '\0';
  pcVar3[1] = '\0';
  pcVar3[2] = '\0';
  pcVar3[3] = '\0';
  pcVar3[4] = '\0';
  pcVar3[5] = '\0';
  pcVar3[6] = '\0';
  pcVar3[7] = '\0';
  *(uint *)(tbase + uVar6 + 0x380) = uVar2;
  pcVar3 = tbase + uVar6 + 0x58;
  lVar5 = 0x20;
  do {
    *(char **)(pcVar3 + 0x18) = pcVar3;
    *(char **)(pcVar3 + 0x10) = pcVar3;
    pcVar3 = pcVar3 + 0x10;
    lVar5 = lVar5 + -1;
  } while (lVar5 != 0);
  uVar4 = (ulong)(-(int)pcVar1 - 0x3c0U & 0xf);
  *(char **)(pcVar1 + 0x38) = pcVar1 + uVar4 + 0x3b0;
  *(char **)(pcVar1 + 0x20) = tbase + ((tsize - (long)(pcVar1 + 0x3b0)) - uVar4) + -0x50;
  *(ulong *)(pcVar1 + uVar4 + 0x3b8) =
       (ulong)(tbase + ((tsize - (long)(pcVar1 + 0x3b0)) - uVar4) + -0x50) | 1;
  pcVar3 = tbase + (tsize - 0x48);
  pcVar3[0] = 'P';
  pcVar3[1] = '\0';
  pcVar3[2] = '\0';
  pcVar3[3] = '\0';
  pcVar3[4] = '\0';
  pcVar3[5] = '\0';
  pcVar3[6] = '\0';
  pcVar3[7] = '\0';
  *(size_t *)(pcVar1 + 0x40) = mparams.trim_threshold;
  return (mstate)(tbase + uVar6 + 0x10);
}

Assistant:

static mstate init_user_mstate(char* tbase, size_t tsize) {
  size_t msize = pad_request(sizeof(struct malloc_state));
  mchunkptr mn;
  mchunkptr msp = align_as_chunk(tbase);
  mstate m = (mstate)(chunk2mem(msp));
  memset(m, 0, msize);
  (void)INITIAL_LOCK(&m->mutex);
  msp->head = (msize|INUSE_BITS);
  m->seg.base = m->least_addr = tbase;
  m->seg.size = m->footprint = m->max_footprint = tsize;
  m->magic = mparams.magic;
  m->release_checks = MAX_RELEASE_CHECK_RATE;
  m->mflags = mparams.default_mflags;
  m->extp = 0;
  m->exts = 0;
  disable_contiguous(m);
  init_bins(m);
  mn = next_chunk(mem2chunk(m));
  init_top(m, mn, (size_t)((tbase + tsize) - (char*)mn) - TOP_FOOT_SIZE);
  check_top_chunk(m, m->top);
  return m;
}